

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

void shopper_financial_report(void)

{
  level *lev;
  char rmno;
  monst *pmVar1;
  long lVar2;
  monst *pmVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  
  lev = level;
  rmno = inside_shop(level,u.ux,u.uy);
  pmVar1 = shop_keeper(lev,rmno);
  if (pmVar1 == (monst *)0x0) {
    pmVar1 = (monst *)0x0;
  }
  else if (pmVar1[0x1b].mappearance == 0) {
    lVar2 = shop_debt((eshk *)&pmVar1->field_0x74);
    if (lVar2 == 0) {
      pmVar1 = (monst *)0x0;
      pline("You have no credit or debt in here.");
    }
  }
  for (uVar6 = (uint)(pmVar1 == (monst *)0x0); uVar6 != 2; uVar6 = uVar6 + 1) {
    pmVar3 = (monst *)&level->monlist;
    while( true ) {
      pmVar3 = next_shkp(pmVar3->nmon,'\0');
      if (pmVar3 == (monst *)0x0) break;
      if (uVar6 == (pmVar3 != pmVar1)) {
        lVar2 = (long)(int)pmVar3[0x1b].mappearance;
        if (lVar2 == 0) {
          if (pmVar3 == pmVar1) {
            pline("You have no credit in here.");
          }
        }
        else {
          pcVar4 = currency(lVar2);
          pcVar5 = s_suffix((char *)((long)&pmVar3[0x1c].minvent + 5));
          pline("You have %ld %s credit at %s %s.",lVar2,pcVar4,pcVar5,
                (&PTR_false_rumor_start_0030b490)[(long)(short)pmVar3[0x1b].misc_worn_check * 0x18])
          ;
        }
        lVar2 = shop_debt((eshk *)&pmVar3->field_0x74);
        if (lVar2 == 0) {
          if (pmVar3 == pmVar1) {
            pline("You don\'t owe any money here.");
          }
        }
        else {
          pcVar4 = currency(lVar2);
          pline("You owe %s %ld %s.",(undefined1 *)((long)&pmVar3[0x1c].minvent + 5),lVar2,pcVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void shopper_financial_report(void)
{
	struct monst *shkp, *this_shkp = shop_keeper(level, inside_shop(level, u.ux, u.uy));
	struct eshk *eshkp;
	long amt;
	int pass;

	if (this_shkp &&
	    !(ESHK(this_shkp)->credit || shop_debt(ESHK(this_shkp)))) {
	    pline("You have no credit or debt in here.");
	    this_shkp = 0;	/* skip first pass */
	}

	/* pass 0: report for the shop we're currently in, if any;
	   pass 1: report for all other shops on this level. */
	for (pass = this_shkp ? 0 : 1; pass <= 1; pass++)
	    for (shkp = next_shkp(level->monlist, FALSE);
		    shkp; shkp = next_shkp(shkp->nmon, FALSE)) {
		if ((shkp != this_shkp) ^ pass) continue;
		eshkp = ESHK(shkp);
		if ((amt = eshkp->credit) != 0)
		    pline("You have %ld %s credit at %s %s.",
			amt, currency(amt), s_suffix(shkname(shkp)),
			shtypes[eshkp->shoptype - SHOPBASE].name);
		else if (shkp == this_shkp)
		    pline("You have no credit in here.");
		if ((amt = shop_debt(eshkp)) != 0)
		    pline("You owe %s %ld %s.",
			shkname(shkp), amt, currency(amt));
		else if (shkp == this_shkp)
		    pline("You don't owe any money here.");
	    }
}